

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cc
# Opt level: O0

void time_map_fetch<EasyUseMap<HashObject<4,4>,int>>
               (int iters,vector<int,_std::allocator<int>_> *indices,char *title)

{
  bool bVar1;
  mapped_type *pmVar2;
  const_reference pvVar3;
  size_t in_RDX;
  vector<int,_std::allocator<int>_> *in_RSI;
  int in_EDI;
  char *unaff_retaddr;
  double ut;
  int i;
  int r;
  Rusage t;
  EasyUseMap<HashObject<4,_4>,_int> set;
  map<HashObject<4,_4>,_int,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
  *in_stack_ffffffffffffff58;
  Rusage *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  _Self local_80;
  HashObject<4,_4> local_74;
  _Self local_70;
  HashObject<4,_4> in_stack_ffffffffffffff98;
  int iVar4;
  undefined4 in_stack_ffffffffffffffa0;
  uint __seed;
  undefined4 in_stack_ffffffffffffffa4;
  size_t in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff8;
  
  EasyUseMap<HashObject<4,_4>,_int>::EasyUseMap((EasyUseMap<HashObject<4,_4>,_int> *)0x1d6808);
  Rusage::Rusage(in_stack_ffffffffffffff60);
  for (iVar4 = 0; iVar4 < in_EDI; iVar4 = iVar4 + 1) {
    in_stack_ffffffffffffff74 = iVar4 + 1;
    HashObject<4,_4>::HashObject((HashObject<4,_4> *)&stack0xffffffffffffff98,iVar4);
    pmVar2 = std::
             map<HashObject<4,_4>,_int,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
             ::operator[]((map<HashObject<4,_4>,_int,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
                           *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                          (key_type *)CONCAT44(iVar4,in_stack_ffffffffffffff98.i_));
    *pmVar2 = in_stack_ffffffffffffff74;
  }
  __seed = 1;
  Rusage::Reset(in_stack_ffffffffffffff60);
  for (iVar4 = 0; iVar4 < in_EDI; iVar4 = iVar4 + 1) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](in_RSI,(long)iVar4);
    HashObject<4,_4>::HashObject(&local_74,*pvVar3);
    local_70._M_node =
         (_Base_ptr)
         std::
         map<HashObject<4,_4>,_int,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
         ::find(in_stack_ffffffffffffff58,(key_type *)0x1d68e2);
    local_80._M_node =
         (_Base_ptr)
         std::
         map<HashObject<4,_4>,_int,_std::less<HashObject<4,_4>_>,_std::allocator<std::pair<const_HashObject<4,_4>,_int>_>_>
         ::end(in_stack_ffffffffffffff58);
    bVar1 = std::operator!=(&local_70,&local_80);
    __seed = bVar1 ^ __seed;
  }
  Rusage::UserTime((Rusage *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  iVar4 = (int)((ulong)in_RSI >> 0x20);
  srand(__seed);
  report(unaff_retaddr,(double)CONCAT44(in_EDI,in_stack_fffffffffffffff8),iVar4,in_RDX,
         in_stack_ffffffffffffffe0);
  EasyUseMap<HashObject<4,_4>,_int>::~EasyUseMap((EasyUseMap<HashObject<4,_4>,_int> *)0x1d6980);
  return;
}

Assistant:

static void time_map_fetch(int iters, const vector<int>& indices,
                           char const* title) {
  MapType set;
  Rusage t;
  int r;
  int i;

  for (i = 0; i < iters; i++) {
    set[i] = i + 1;
  }

  r = 1;
  t.Reset();
  for (i = 0; i < iters; i++) {
    r ^= static_cast<int>(set.find(indices[i]) != set.end());
  }
  double ut = t.UserTime();

  srand(r);  // keep compiler from optimizing away r (we never call rand())
  report(title, ut, iters, 0, 0);
}